

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::add<std::__cxx11::string,cmdline::oneof_reader<std::__cxx11::string>>
          (parser *this,string *name,char short_name,string *desc,bool need,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def,
          oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *reader)

{
  byte bVar1;
  string *desc_00;
  char short_name_00;
  string *name_00;
  size_type sVar2;
  cmdline_error *this_00;
  option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  mapped_type *ppoVar3;
  oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def_local;
  string *psStack_28;
  bool need_local;
  string *desc_local;
  string *psStack_18;
  char short_name_local;
  string *name_local;
  parser *this_local;
  
  local_38 = def;
  def_local._7_1_ = need;
  psStack_28 = desc;
  desc_local._7_1_ = short_name;
  psStack_18 = name;
  name_local = (string *)this;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar2 != 0) {
    local_65 = 1;
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_58,"multiple definition: ",psStack_18);
    cmdline_error::cmdline_error(this_00,&local_58);
    local_65 = 0;
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  this_01 = (option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0xb0);
  name_00 = psStack_18;
  short_name_00 = desc_local._7_1_;
  bVar1 = def_local._7_1_;
  std::__cxx11::string::string((string *)&local_88,(string *)def);
  desc_00 = psStack_28;
  oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  oneof_reader(&local_a0,reader);
  option_with_value_with_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::option_with_value_with_reader
            (this_01,name_00,short_name_00,(bool)(bVar1 & 1),&local_88,desc_00,&local_a0);
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,psStack_18);
  *ppoVar3 = (mapped_type)this_01;
  oneof_reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~oneof_reader(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,psStack_18);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back(&this->ordered,ppoVar3);
  return;
}

Assistant:

void add(const std::string &name,
           char short_name=0,
           const std::string &desc="",
           bool need=true,
           const T def=T(),
           F reader=F()){
    if (options.count(name)) throw cmdline_error("multiple definition: "+name);
    options[name]=new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
    ordered.push_back(options[name]);
  }